

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeTextUtil.cc
# Opt level: O2

void __thiscall
encodeTextUtil::encodeTextUtil(encodeTextUtil *this,int *lockParameters,char **names,int lockIndex)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  _Self __tmp;
  lock *this_00;
  iterator iVar4;
  mapped_type *ppdVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  duplicateKeys *pdVar8;
  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
  *this_01;
  bool bVar9;
  char local_9a;
  char local_99;
  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
  *local_98;
  uint local_8c;
  encodeTextUtil *local_88;
  _Base_ptr local_80;
  char *key;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> duplicates;
  timespec seedTime;
  
  this_01 = &this->characterToKeyObject;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80 = &(this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_80;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_80;
  (this->characterToKeyObject)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->characterToKeyObjectIterator)._M_node = (_Base_ptr)0x0;
  this_00 = (lock *)operator_new(0x40);
  lock::lock(this_00,lockParameters + lockIndex * 3,names[lockIndex]);
  this->lockObject = this_00;
  clock_gettime(1,(timespec *)&seedTime);
  duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &duplicates._M_t._M_impl.super__Rb_tree_header._M_header;
  duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_8c = (uint)seedTime.tv_nsec;
  duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar9 = false;
  local_98 = this_01;
  local_88 = this;
  duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    iVar2 = rand_r(&local_8c);
    (this->overlay).seed = iVar2;
    lock::check(this->lockObject,(char *)this,4);
    uVar3 = lock::getARealKey(this->lockObject,&key);
    if ((int)uVar3 < 7) {
      fprintf(_stderr,"Shouldn\'t have gotten a key this small: %d",(ulong)uVar3);
    }
    else {
      cVar1 = key[(ulong)uVar3 - 1];
      local_9a = cVar1;
      iVar4 = std::
              _Rb_tree<char,_std::pair<const_char,_duplicateKeys_*>,_std::_Select1st<std::pair<const_char,_duplicateKeys_*>_>,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
              ::find(&this_01->_M_t,&local_9a);
      (this->characterToKeyObjectIterator)._M_node = iVar4._M_node;
      if (iVar4._M_node == local_80) {
        pdVar8 = (duplicateKeys *)operator_new(0x10);
        duplicateKeys::duplicateKeys(pdVar8);
        local_9a = cVar1;
        ppdVar5 = std::
                  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
                  ::operator[](this_01,&local_9a);
        *ppdVar5 = pdVar8;
        local_9a = cVar1;
        ppdVar5 = std::
                  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
                  ::operator[](this_01,&local_9a);
        this = local_88;
        pdVar8 = *ppdVar5;
        iVar2 = lock::seedOf(local_88->lockObject);
        iVar2 = duplicateKeys::insert(pdVar8,iVar2);
        local_99 = cVar1;
        pmVar6 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::operator[](&duplicates,&local_99);
        *pmVar6 = iVar2;
        this_01 = local_98;
      }
      else {
        local_9a = cVar1;
        ppdVar5 = std::
                  map<char,_duplicateKeys_*,_std::less<char>,_std::allocator<std::pair<const_char,_duplicateKeys_*>_>_>
                  ::operator[](this_01,&local_9a);
        pdVar8 = *ppdVar5;
        iVar2 = lock::seedOf(this->lockObject);
        iVar2 = duplicateKeys::insert(pdVar8,iVar2);
        local_99 = cVar1;
        pmVar6 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                 ::operator[](&duplicates,&local_99);
        *pmVar6 = iVar2;
        if (0xff < duplicates._M_t._M_impl.super__Rb_tree_header._M_node_count) {
          bVar9 = true;
          for (p_Var7 = duplicates._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var7 != &duplicates._M_t._M_impl.super__Rb_tree_header;
              p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
            bVar9 = (bool)(bVar9 & 3 < *(int *)&p_Var7[1].field_0x4);
          }
        }
      }
    }
  } while (!bVar9);
  std::
  _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
  ::~_Rb_tree(&duplicates._M_t);
  return;
}

Assistant:

encodeTextUtil::encodeTextUtil(int * lockParameters, const char ** names, int lockIndex) {
  char * key;
  lockObject = new lock(lockParameters+3*lockIndex, *(names+lockIndex));
  int size;
  bool done = false;
  unsigned int rand_seed = 31416;
  struct timespec seedTime;
  clock_gettime(CLOCK_MONOTONIC, &seedTime);
  rand_seed = seedTime.tv_nsec & 0xffffffff;

  std::map<char, int>  duplicates;
  do {
    overlay.seed = rand_r(&rand_seed);
    lockObject->check(overlay.bytes, 4);
    size = lockObject->getARealKey(&key);
    if (size > 6) {
      int c = key[size - 1];
      characterToKeyObjectIterator = characterToKeyObject.find(c);
      if (characterToKeyObjectIterator != characterToKeyObject.end()) {
        duplicates[c] = characterToKeyObject[c]->insert(lockObject->seedOf());
        if (duplicates.size() >= 256) {
          done = true;
          for (std::map<char, int>::iterator it = duplicates.begin(); it != duplicates.end(); it++) {
            done &= (it->second > 3);
          }
        }
      } else {
        characterToKeyObject[c] = new duplicateKeys();
        duplicates[c] = characterToKeyObject[c]->insert(lockObject->seedOf());
      }
    } else {
      fprintf(stderr, "Shouldn't have gotten a key this small: %d", size);
    }
  } while (!done);
}